

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacroCommand.cpp
# Opt level: O0

void __thiscall MacroCommand::Execute(MacroCommand *this)

{
  bool bVar1;
  Command *pCVar2;
  Command *c;
  ListIterator<Command_*> i;
  MacroCommand *this_local;
  
  i._current = (long)this;
  ListIterator<Command_*>::ListIterator
            ((ListIterator<Command_*> *)&c,*(List<Command_*> **)(this + 8));
  ListIterator<Command_*>::First((ListIterator<Command_*> *)&c);
  while( true ) {
    bVar1 = ListIterator<Command_*>::IsDone((ListIterator<Command_*> *)&c);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = ListIterator<Command_*>::CurrentItem((ListIterator<Command_*> *)&c);
    (*pCVar2->_vptr_Command[2])();
    ListIterator<Command_*>::Next((ListIterator<Command_*> *)&c);
  }
  return;
}

Assistant:

void MacroCommand::Execute()
{
    ListIterator<Command*> i(_cmds);

    for (i.First(); !i.IsDone(); i.Next())
    {
        Command* c = i.CurrentItem();
        c->Execute();
    }
}